

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O2

void prsxgen_spec(prscxdef *ctx)

{
  prsndef *expr;
  
  expr = prsexpr(ctx);
  prs_check_spec(ctx,expr);
  prsgexp(ctx,expr);
  ctx->prscxnode = ctx->prscxnrst;
  ctx->prscxnrem = ctx->prscxrrst;
  return;
}

Assistant:

void prsxgen_spec(prscxdef *ctx)
{
    prsndef *exprnode;

    /* parse the expression */
    exprnode = prsexpr(ctx);

    /* check for speculative execution problems */
    prs_check_spec(ctx, exprnode);

    /* generate the expression, then reset the parse node pool */
    prsgexp(ctx, exprnode);
    prsrstn(ctx);
}